

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<8ul,GF2::MOGrevlex<8ul>>::ModGB<GF2::MOGrevlex<8ul>>
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  undefined1 uVar1;
  undefined1 uVar2;
  MM<8UL> *in_RDI;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  MM<8UL> lm;
  bool changed;
  Geobucket<4UL> gb;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  Geobucket<4UL> *in_stack_ffffffffffffff60;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff80;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff88;
  Geobucket<4UL> *in_stack_ffffffffffffff90;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff98;
  Geobucket<4UL> *in_stack_ffffffffffffffa0;
  byte local_41;
  
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<4UL>::Geobucket
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::SetEmpty((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d3528);
  local_41 = 0;
  MM<8UL>::MM((MM<8UL> *)0x1d3537);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::MP
            ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff60,
             (MOGrevlex<8UL> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  while (uVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<4UL>::PopLM
                           (in_stack_ffffffffffffff90,(MM<8UL> *)in_stack_ffffffffffffff88),
        (bool)uVar1) {
    MP<8UL,_GF2::MOGrevlex<8UL>_>::LM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff60);
    uVar2 = MM<8UL>::IsDivisibleBy
                      ((MM<8UL> *)in_stack_ffffffffffffff68,(MM<8UL> *)in_stack_ffffffffffffff60);
    if ((bool)uVar2) {
      local_41 = 1;
      in_stack_ffffffffffffff68 =
           MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
                     ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff60,
                      (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      MP<8UL,_GF2::MOGrevlex<8UL>_>::PopLM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d35c7);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::LM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff60);
      MM<8UL>::operator/=((MM<8UL> *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff70)),
                          (MM<8UL> *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff60 =
           (Geobucket<4UL> *)
           MP<8UL,_GF2::MOGrevlex<8UL>_>::operator*=(in_stack_ffffffffffffff80,in_RDI);
      MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<4UL>::SymDiffSplice
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
                ((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)
                 CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff70)),
                 (value_type *)in_stack_ffffffffffffff68);
    }
  }
  MP<8UL,_GF2::MOGrevlex<8UL>_>::~MP((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d365c);
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<4UL>::~Geobucket(in_stack_ffffffffffffff60);
  return (bool)(local_41 & 1);
}

Assistant:

bool ModGB(const MP<_n, _O1>& polyRight)
	{	
		// поскольку операция выбора старшего монома задействована,
		// коэффициент роста geobucket выберем равным 4
		Geobucket<4> gb(*this);
		// будем сохранять в this остаток
		SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP poly(_order);
		while (gb.PopLM(lm))
			// делимость старших мономов?
			if (lm.IsDivisibleBy(polyRight.LM()))
			{
				changed = true;
				// готовим множитель
				(poly = polyRight).PopLM();
				// перемножаем и добавляем в geobucket
                gb.SymDiffSplice(poly *= (lm /= polyRight.LM()));
			}
			else
				// заносим lm в остаток
				push_back(lm);
		return changed;
	}